

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::IsCFBundleOnApple(cmGeneratorTarget *this)

{
  TargetType TVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  string local_68;
  string local_48;
  
  TVar1 = this->Target->TargetTypeValue;
  if (TVar1 == MODULE_LIBRARY) {
    this_00 = this->Makefile;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"APPLE","");
    bVar2 = cmMakefile::IsOn(this_00,&local_48);
    if (bVar2) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"BUNDLE","");
      bVar3 = cmTarget::GetPropertyAsBool(this->Target,&local_68);
      bVar2 = true;
      goto LAB_002e9313;
    }
  }
  bVar2 = false;
  bVar3 = false;
LAB_002e9313:
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2)) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((TVar1 == MODULE_LIBRARY) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}